

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,StringPtr arr)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  PipelineOp *e;
  char *pcVar4;
  
  pcVar4 = arr.content.ptr;
  uVar3 = (int)arr.content.size_ * 4;
  for (lVar2 = arr.content.size_ << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    uVar1 = capnp::operator*(pcVar4);
    uVar3 = uVar3 * 0x5bd1e995 ^ (uVar1 * 0x5bd1e995 >> 0x18 ^ uVar1 * 0x5bd1e995) * 0x5bd1e995;
    pcVar4 = pcVar4 + 8;
  }
  uVar3 = (uVar3 >> 0xd ^ uVar3) * 0x5bd1e995;
  return uVar3 >> 0xf ^ uVar3;
}

Assistant:

inline uint HashCoder::operator*(ArrayPtr<T> arr) const {
  // Hash each array element to create a string of hashes, then murmur2 over those.
  //
  // TODO(perf): Choose a more-modern hash. (See hash.c++.)

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = arr.size() * sizeof(uint);

  for (auto& e: arr) {
    uint k = kj::hashCode(e);
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}